

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O0

void __thiscall
Lodtalk::VMContext::executeScriptFromFile(VMContext *this,FILE *file,string *name,string *basePath)

{
  anon_class_24_3_bae7728e local_60;
  WithInterpreterBlock local_48;
  string *local_28;
  string *basePath_local;
  string *name_local;
  FILE *file_local;
  VMContext *this_local;
  
  local_60.file = (FILE **)&name_local;
  local_60.name = name;
  local_60.basePath = basePath;
  local_28 = basePath;
  basePath_local = name;
  name_local = (string *)file;
  file_local = (FILE *)this;
  std::function<void(Lodtalk::InterpreterProxy*)>::
  function<Lodtalk::VMContext::executeScriptFromFile(_IO_FILE*,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,void>
            ((function<void(Lodtalk::InterpreterProxy*)> *)&local_48,&local_60);
  withInterpreter(this,&local_48);
  std::function<void_(Lodtalk::InterpreterProxy_*)>::~function(&local_48);
  return;
}

Assistant:

void VMContext::executeScriptFromFile(FILE *file, const std::string &name, const std::string &basePath)
{
    withInterpreter([&](InterpreterProxy *interpreter) {
        Lodtalk::executeScriptFromFile(interpreter, file, name, basePath);
    });
}